

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

path * module_build_path(path *__return_storage_ptr__,string *module)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  path local_90;
  path local_70;
  path local_50;
  path local_30;
  
  __first._M_current = (module->_M_dataplus)._M_p;
  local_70.m_pathname._M_dataplus._M_p._0_1_ = (string)0x7e;
  local_90.m_pathname._M_dataplus._M_p._0_1_ = (string)0x2f;
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + module->_M_string_length),(char *)&local_70,
             (char *)&local_90);
  boost::filesystem::path::path(&local_90,"libs");
  std::__cxx11::string::string((string *)&local_30,(string *)module);
  boost::filesystem::operator/(&local_70,&local_90,&local_30);
  boost::filesystem::path::path(&local_50,"build");
  boost::filesystem::operator/(__return_storage_ptr__,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

static fs::path module_build_path( std::string module )
{
    std::replace( module.begin(), module.end(), '~', '/' );
    return fs::path( "libs" ) / module / "build";
}